

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  Nonnull<const_char_*> pcVar1;
  void *v2;
  void *v1;
  
  v1 = (void *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v1 & 1) != 0) {
    v1 = *(void **)((ulong)v1 & 0xfffffffffffffffe);
  }
  v2 = (void *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)v2 & 1) != 0) {
    v2 = *(void **)((ulong)v2 & 0xfffffffffffffffe);
  }
  if (v1 == v2) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,v2,"lhs->GetArena() == rhs->GetArena()");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    InternalSwap(this,lhs,rhs);
    return;
  }
  UnsafeArenaSwap();
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  InternalSwap(lhs, rhs);
}